

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O1

void dynamic_api_suite::api_remove_iterator(void)

{
  long lVar1;
  iterator where;
  pair<int,_int> array [4];
  undefined8 *local_70;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 local_58 [5];
  
  lVar1 = 0;
  do {
    *(undefined8 *)((long)local_58 + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  local_58[0] = 0x10000000b;
  local_70 = local_58;
  local_68 = local_58;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.insert({ 11, 1 })","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x68,"void dynamic_api_suite::api_remove_iterator()",&local_70,&local_68);
  local_70 = (undefined8 *)0x1;
  local_68 = (undefined8 *)CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x69,"void dynamic_api_suite::api_remove_iterator()",&local_70,&local_68);
  local_70 = local_58;
  local_68 = local_58;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("where","span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x6c,"void dynamic_api_suite::api_remove_iterator()",&local_70,&local_68);
  local_68 = (undefined8 *)0x0;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x6d,"void dynamic_api_suite::api_remove_iterator()",&local_68,&local_5c);
  return;
}

Assistant:

void api_remove_iterator()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    BOOST_TEST_EQ(span.insert({ 11, 1 }), span.begin());
    BOOST_TEST_EQ(span.size(), 1);
    // Split into two lines because remove() does not preserve iterator stability
    auto where = span.remove(span.begin());
    BOOST_TEST_EQ(where, span.end());
    BOOST_TEST_EQ(span.size(), 0);
}